

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cpp
# Opt level: O0

list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *
Liby::Resolver::resolve
          (list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *__return_storage_ptr__,
          string *host,string *service)

{
  int iVar1;
  char *__name;
  char *__service;
  Endpoint local_98;
  addrinfo *local_90;
  addrinfo *aip;
  function<void_()> local_80;
  undefined1 local_60 [8];
  DeferCaller caller;
  int err;
  addrinfo *ailist;
  string *service_local;
  string *host_local;
  list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *ret;
  
  ailist = (addrinfo *)service;
  service_local = host;
  host_local = (string *)__return_storage_ptr__;
  std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>::list(__return_storage_ptr__);
  __name = (char *)std::__cxx11::string::data();
  __service = (char *)std::__cxx11::string::data();
  iVar1 = getaddrinfo(__name,__service,(addrinfo *)0x0,(addrinfo **)&err);
  if (iVar1 == 0) {
    aip = _err;
    std::function<void()>::
    function<Liby::Resolver::resolve(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0,void>
              ((function<void()> *)&local_80,(anon_class_8_1_4ca45a04 *)&aip);
    DeferCaller::DeferCaller((DeferCaller *)local_60,&local_80);
    std::function<void_()>::~function(&local_80);
    for (local_90 = _err; local_90 != (addrinfo *)0x0; local_90 = local_90->ai_next) {
      Endpoint::Endpoint(&local_98,local_90);
      std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>::push_back
                (__return_storage_ptr__,&local_98);
    }
    DeferCaller::~DeferCaller((DeferCaller *)local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::list<Endpoint> Resolver::resolve(const std::string &host,
                                      const std::string &service) {
    struct addrinfo *ailist;
    std::list<Endpoint> ret;

    int err = ::getaddrinfo(host.data(), service.data(), nullptr, &ailist);
    if (err != 0) {
        ; // throw err string
    } else {
        DeferCaller caller([ailist] { ::freeaddrinfo(ailist); });

        struct addrinfo *aip = ailist;
        for (; aip != NULL; aip = aip->ai_next) {
            ret.push_back(Endpoint(aip));
        }
    }
    return ret;
}